

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O0

Hop_Obj_t * Abc_NodeBuildFromMiniInt(Hop_Man_t *pMan,Vec_Int_t *vAig,int nLeaves)

{
  int iVar2;
  uint uVar3;
  int Lit;
  int i_00;
  int i_01;
  Hop_Obj_t *pHVar4;
  Hop_Obj_t *p1;
  Hop_Obj_t *local_80;
  Hop_Obj_t *local_70;
  Hop_Obj_t *local_50;
  Hop_Obj_t *piLit;
  Hop_Obj_t *piLit1;
  Hop_Obj_t *piLit0;
  int iLit1;
  int iLit0;
  int iVar1;
  int iVar0;
  int i;
  int nLeaves_local;
  Vec_Int_t *vAig_local;
  Hop_Man_t *pMan_local;
  
  iVar2 = Vec_IntSize(vAig);
  if (iVar2 < 1) {
    __assert_fail("Vec_IntSize(vAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                  ,0x17c,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
  }
  iVar2 = Vec_IntEntryLast(vAig);
  if (1 < iVar2) {
    __assert_fail("Vec_IntEntryLast(vAig) < 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                  ,0x17d,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
  }
  iVar2 = Vec_IntSize(vAig);
  if (iVar2 == 1) {
    if (nLeaves != 0) {
      __assert_fail("nLeaves == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                    ,0x180,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
    }
    pHVar4 = Hop_ManConst0(pMan);
    iVar2 = Vec_IntEntry(vAig,0);
    pMan_local = (Hop_Man_t *)Hop_NotCond(pHVar4,iVar2);
  }
  else {
    iVar2 = Vec_IntSize(vAig);
    if (iVar2 == 2) {
      iVar2 = Vec_IntEntry(vAig,0);
      if (iVar2 != 0) {
        __assert_fail("Vec_IntEntry(vAig, 0) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                      ,0x185,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
      }
      if (nLeaves != 1) {
        __assert_fail("nLeaves == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                      ,0x186,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
      }
      pHVar4 = Hop_IthVar(pMan,0);
      iVar2 = Vec_IntEntry(vAig,1);
      pMan_local = (Hop_Man_t *)Hop_NotCond(pHVar4,iVar2);
    }
    else {
      local_50 = (Hop_Obj_t *)0x0;
      uVar3 = Vec_IntSize(vAig);
      if ((uVar3 & 1) == 0) {
        __assert_fail("Vec_IntSize(vAig) & 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                      ,0x18d,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
      }
      for (iVar1 = 0; iVar2 = Vec_IntSize(vAig), iVar1 + 1 < iVar2; iVar1 = iVar1 + 2) {
        iVar2 = Vec_IntEntry(vAig,iVar1);
        Lit = Vec_IntEntry(vAig,iVar1 + 1);
        i_00 = Abc_Lit2Var(iVar2);
        i_01 = Abc_Lit2Var(Lit);
        if (i_00 < nLeaves) {
          local_70 = Hop_IthVar(pMan,i_00);
        }
        else {
          local_70 = (Hop_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vAig,i_00 - nLeaves);
        }
        iVar2 = Abc_LitIsCompl(iVar2);
        pHVar4 = Hop_NotCond(local_70,iVar2);
        if (i_01 < nLeaves) {
          local_80 = Hop_IthVar(pMan,i_01);
        }
        else {
          local_80 = (Hop_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vAig,i_01 - nLeaves);
        }
        iVar2 = Abc_LitIsCompl(Lit);
        p1 = Hop_NotCond(local_80,iVar2);
        local_50 = Hop_And(pMan,pHVar4,p1);
        iVar2 = Abc_Lit2Var(iVar1);
        Vec_PtrWriteEntry((Vec_Ptr_t *)vAig,iVar2,local_50);
      }
      iVar2 = Vec_IntSize(vAig);
      if (iVar1 != iVar2 + -1) {
        __assert_fail("i == Vec_IntSize(vAig) - 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                      ,0x198,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
      }
      iVar2 = Vec_IntEntry(vAig,iVar1);
      pMan_local = (Hop_Man_t *)Hop_NotCond(local_50,iVar2);
      Vec_IntClear(vAig);
    }
  }
  return (Hop_Obj_t *)pMan_local;
}

Assistant:

Hop_Obj_t * Abc_NodeBuildFromMiniInt( Hop_Man_t * pMan, Vec_Int_t * vAig, int nLeaves )
{
    assert( Vec_IntSize(vAig) > 0 );
    assert( Vec_IntEntryLast(vAig) < 2 );
    if ( Vec_IntSize(vAig) == 1 ) // const
    {
        assert( nLeaves == 0 );
        return Hop_NotCond( Hop_ManConst0(pMan), Vec_IntEntry(vAig, 0) );
    }
    if ( Vec_IntSize(vAig) == 2 ) // variable
    {
        assert( Vec_IntEntry(vAig, 0) == 0 );
        assert( nLeaves == 1 );
        return Hop_NotCond( Hop_IthVar(pMan, 0), Vec_IntEntry(vAig, 1) );
    }
    else
    {
        int i, iVar0, iVar1, iLit0, iLit1;
        Hop_Obj_t * piLit0, * piLit1, * piLit = NULL;
        assert( Vec_IntSize(vAig) & 1 );
        Vec_IntForEachEntryDouble( vAig, iLit0, iLit1, i )
        {
            iVar0 = Abc_Lit2Var( iLit0 );
            iVar1 = Abc_Lit2Var( iLit1 );
            piLit0 = Hop_NotCond( iVar0 < nLeaves ? Hop_IthVar(pMan, iVar0) : (Hop_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vAig, iVar0 - nLeaves), Abc_LitIsCompl(iLit0) );
            piLit1 = Hop_NotCond( iVar1 < nLeaves ? Hop_IthVar(pMan, iVar1) : (Hop_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vAig, iVar1 - nLeaves), Abc_LitIsCompl(iLit1) );
            piLit  = Hop_And( pMan, piLit0, piLit1 );
            assert( (i & 1) == 0 );
            Vec_PtrWriteEntry( (Vec_Ptr_t *)vAig, Abc_Lit2Var(i), piLit );  // overwriting entries
        }
        assert( i == Vec_IntSize(vAig) - 1 );
        piLit = Hop_NotCond( piLit, Vec_IntEntry(vAig, i) );
        Vec_IntClear( vAig ); // useless
        return piLit;
    }
}